

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3WalkExprList(Walker *pWalker,ExprList *p)

{
  int iVar1;
  int iVar2;
  int *in_RSI;
  ExprList_item *pItem;
  int i;
  Expr *pExpr;
  undefined4 in_stack_ffffffffffffffe0;
  
  if (in_RSI != (int *)0x0) {
    pExpr = (Expr *)(in_RSI + 2);
    for (iVar2 = *in_RSI; 0 < iVar2; iVar2 = iVar2 + -1) {
      iVar1 = sqlite3WalkExpr((Walker *)CONCAT44(iVar2,in_stack_ffffffffffffffe0),pExpr);
      if (iVar1 != 0) {
        return 2;
      }
      pExpr = (Expr *)&pExpr->pRight;
    }
  }
  return 0;
}

Assistant:

SQLITE_PRIVATE int sqlite3WalkExprList(Walker *pWalker, ExprList *p){
  int i;
  struct ExprList_item *pItem;
  if( p ){
    for(i=p->nExpr, pItem=p->a; i>0; i--, pItem++){
      if( sqlite3WalkExpr(pWalker, pItem->pExpr) ) return WRC_Abort;
    }
  }
  return WRC_Continue;
}